

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

ResendRequest *
anon_unknown.dwarf_334836::createT11ResendRequest
          (ResendRequest *__return_storage_ptr__,char *sender,char *target,int seq,int begin,int end
          )

{
  undefined1 *this;
  int iVar1;
  FieldBase local_70;
  
  FIXT11::ResendRequest::ResendRequest(__return_storage_ptr__);
  FIX::BeginSeqNo::BeginSeqNo((BeginSeqNo *)&local_70,(ulong)target & 0xffffffff);
  FIXT11::ResendRequest::set(__return_storage_ptr__,(BeginSeqNo *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::EndSeqNo::EndSeqNo((EndSeqNo *)&local_70,2);
  FIXT11::ResendRequest::set(__return_storage_ptr__,(EndSeqNo *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_70,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_70,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_70,true);
  FIX::FieldBase::~FieldBase(&local_70);
  return __return_storage_ptr__;
}

Assistant:

FIXT11::ResendRequest createT11ResendRequest(const char *sender, const char *target, int seq, int begin, int end) {
  FIXT11::ResendRequest resendRequest;
  resendRequest.set(BeginSeqNo(begin));
  resendRequest.set(EndSeqNo(end));
  fillHeader(resendRequest.getHeader(), sender, target, seq);
  resendRequest.getHeader().setField(BodyLength(resendRequest.bodyLength()));
  resendRequest.getTrailer().setField(CheckSum(resendRequest.checkSum()));
  return resendRequest;
}